

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

int djgt__mipcnt(int x,int y,int z)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int m;
  
  if (y < x) {
    y = x;
  }
  if (y <= z) {
    y = z;
  }
  uVar3 = y - 1;
  for (uVar2 = 1; uVar2 < 0x20; uVar2 = uVar2 * 2) {
    uVar3 = uVar3 | (int)uVar3 >> ((byte)uVar2 & 0x1f);
  }
  iVar1 = 0;
  for (uVar3 = uVar3 + 1; (uVar3 & 1) == 0; uVar3 = (int)uVar3 >> 1) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int djgt__max3(int x, int y, int z)
{
    int m = x;

    (void)((m < y) && (m = y));
    (void)((m < z) && (m = z));

    return m;
}